

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O2

void __thiscall Pl_PNGFilter::decodePaeth(Pl_PNGFilter *this)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  ulong uVar6;
  uint c;
  ulong uVar7;
  uint a;
  Pl_PNGFilter *this_00;
  
  puVar3 = this->cur_row;
  puVar4 = this->prev_row;
  uVar2 = this->bytes_per_pixel;
  this_00 = this;
  for (uVar7 = 0; uVar7 < this->bytes_per_row; uVar7 = uVar7 + 1) {
    a = 0;
    c = 0;
    if (uVar2 <= uVar7) {
      uVar6 = (ulong)((int)uVar7 - uVar2);
      a = (uint)puVar3[uVar6 + 1];
      c = (uint)puVar4[uVar6 + 1];
    }
    uVar1 = puVar3[uVar7 + 1];
    iVar5 = PaethPredictor(this_00,a,(uint)puVar4[uVar7 + 1],c);
    puVar3[uVar7 + 1] = (char)iVar5 + uVar1;
  }
  return;
}

Assistant:

void
Pl_PNGFilter::decodePaeth()
{
    QTC::TC("libtests", "Pl_PNGFilter decodePaeth");
    unsigned char* buffer = this->cur_row + 1;
    unsigned char* above_buffer = this->prev_row + 1;
    unsigned int bpp = this->bytes_per_pixel;

    for (unsigned int i = 0; i < this->bytes_per_row; ++i) {
        int left = 0;
        int up = above_buffer[i];
        int upper_left = 0;

        if (i >= bpp) {
            left = buffer[i - bpp];
            upper_left = above_buffer[i - bpp];
        }

        buffer[i] =
            static_cast<unsigned char>(buffer[i] + this->PaethPredictor(left, up, upper_left));
    }
}